

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr_conflict ctxt,xmlNodePtr elem,int options)

{
  xmlNsPtr pxVar1;
  bool bVar2;
  int iVar3;
  xmlNsMapItemPtr_conflict pxVar4;
  int local_8c;
  int local_88;
  int j;
  int i;
  int ret;
  int nbRedund;
  int sizeRedund;
  xmlNsPtr *listRedund;
  int optRemoveRedundantNS;
  int ancestorsOnly;
  xmlNsMapItemPtr_conflict mi;
  xmlNsMapPtr nsMap;
  xmlNodePtr curElem;
  xmlNodePtr cur;
  xmlDocPtr doc;
  xmlNsPtr prevns;
  xmlNsPtr ns;
  int parnsdone;
  int adoptns;
  int depth;
  int options_local;
  xmlNodePtr elem_local;
  xmlDOMWrapCtxtPtr_conflict ctxt_local;
  
  parnsdone = -1;
  ns._4_4_ = 0;
  ns._0_4_ = 0;
  nsMap = (xmlNsMapPtr)0x0;
  mi = (xmlNsMapItemPtr_conflict)0x0;
  listRedund._4_4_ = 0;
  listRedund._0_4_ = (uint)((options & 1U) != 0);
  _nbRedund = (xmlNsPtr *)0x0;
  ret = 0;
  i = 0;
  j = 0;
  if (((elem == (xmlNodePtr)0x0) || (elem->doc == (_xmlDoc *)0x0)) ||
     (elem->type != XML_ELEMENT_NODE)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    cur = (xmlNodePtr)elem->doc;
    curElem = elem;
    adoptns = options;
    _depth = elem;
    elem_local = (xmlNodePtr)ctxt;
    do {
      if (curElem->type == XML_ELEMENT_NODE) {
        ns._4_4_ = 1;
        nsMap = (xmlNsMapPtr)curElem;
        parnsdone = parnsdone + 1;
        if (curElem->nsDef != (xmlNs *)0x0) {
          doc = (xmlDocPtr)0x0;
          for (prevns = curElem->nsDef; prevns != (xmlNsPtr)0x0; prevns = prevns->next) {
            if ((int)ns == 0) {
              if (((_depth->parent != (_xmlNode *)0x0) &&
                  (_depth->parent->doc != (_xmlDoc *)_depth->parent)) &&
                 (iVar3 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,_depth->parent),
                 iVar3 == -1)) {
                j = -1;
              }
              ns._0_4_ = 1;
            }
            if ((((uint)listRedund != 0) && (mi != (xmlNsMapItemPtr_conflict)0x0)) &&
               (mi->next != (xmlNsMapItemPtr)0x0)) {
              for (_optRemoveRedundantNS = mi->next; _optRemoveRedundantNS != (xmlNsMapItemPtr)0x0;
                  _optRemoveRedundantNS = _optRemoveRedundantNS->next) {
                if (((-2 < _optRemoveRedundantNS->depth) &&
                    (_optRemoveRedundantNS->shadowDepth == -1)) &&
                   (((prevns->prefix == _optRemoveRedundantNS->newNs->prefix ||
                     (iVar3 = xmlStrEqual(prevns->prefix,_optRemoveRedundantNS->newNs->prefix),
                     iVar3 != 0)) &&
                    ((prevns->href == _optRemoveRedundantNS->newNs->href ||
                     (iVar3 = xmlStrEqual(prevns->href,_optRemoveRedundantNS->newNs->href),
                     iVar3 != 0)))))) {
                  iVar3 = xmlDOMWrapNSNormAddNsMapItem2
                                    ((xmlNsPtr **)&nbRedund,&ret,&i,prevns,
                                     _optRemoveRedundantNS->newNs);
                  if (iVar3 != -1) {
                    if (doc == (xmlDocPtr)0x0) {
                      curElem->nsDef = prevns->next;
                    }
                    else {
                      doc->_private = prevns->next;
                    }
                    goto LAB_0016b034;
                  }
                  j = -1;
                }
              }
            }
            if (((curElem->ns != (xmlNs *)0x0) && (ns._4_4_ != 0)) && (curElem->ns == prevns)) {
              ns._4_4_ = 0;
            }
            if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
              for (_optRemoveRedundantNS = mi->next; _optRemoveRedundantNS != (xmlNsMapItemPtr)0x0;
                  _optRemoveRedundantNS = _optRemoveRedundantNS->next) {
                if (((-2 < _optRemoveRedundantNS->depth) &&
                    (_optRemoveRedundantNS->shadowDepth == -1)) &&
                   ((prevns->prefix == _optRemoveRedundantNS->newNs->prefix ||
                    (iVar3 = xmlStrEqual(prevns->prefix,_optRemoveRedundantNS->newNs->prefix),
                    iVar3 != 0)))) {
                  _optRemoveRedundantNS->shadowDepth = parnsdone;
                }
              }
            }
            pxVar4 = xmlDOMWrapNsMapAddItem((xmlNsMapPtr *)&mi,-1,prevns,prevns,parnsdone);
            if (pxVar4 == (xmlNsMapItemPtr_conflict)0x0) {
              j = -1;
            }
            doc = (xmlDocPtr)prevns;
LAB_0016b034:
          }
        }
        if (ns._4_4_ != 0) goto LAB_0016b053;
LAB_0016b1e8:
        if (curElem->type != XML_ELEMENT_NODE) goto LAB_0016b214;
        if (curElem->properties == (_xmlAttr *)0x0) goto LAB_0016b214;
        curElem = (xmlNodePtr)curElem->properties;
      }
      else {
        if (curElem->type == XML_ATTRIBUTE_NODE) {
LAB_0016b053:
          if (curElem->ns != (xmlNs *)0x0) {
            if ((int)ns == 0) {
              if (((_depth->parent != (_xmlNode *)0x0) &&
                  (_depth->parent->doc != (_xmlDoc *)_depth->parent)) &&
                 (iVar3 = xmlDOMWrapNSNormGatherInScopeNs((xmlNsMapPtr *)&mi,_depth->parent),
                 iVar3 == -1)) {
                j = -1;
              }
              ns._0_4_ = 1;
            }
            if (_nbRedund != (xmlNsPtr *)0x0) {
              local_8c = 0;
              for (local_88 = 0; local_88 < i; local_88 = local_88 + 1) {
                if (curElem->ns == _nbRedund[local_8c]) {
                  curElem->ns = _nbRedund[local_8c + 1];
                  break;
                }
                local_8c = local_8c + 2;
              }
            }
            if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
              for (_optRemoveRedundantNS = mi->next; _optRemoveRedundantNS != (xmlNsMapItemPtr)0x0;
                  _optRemoveRedundantNS = _optRemoveRedundantNS->next) {
                if ((_optRemoveRedundantNS->shadowDepth == -1) &&
                   (curElem->ns == _optRemoveRedundantNS->oldNs)) {
                  curElem->ns = _optRemoveRedundantNS->newNs;
                  goto LAB_0016b1e8;
                }
              }
            }
            iVar3 = xmlDOMWrapNSNormAcquireNormalizedNs
                              ((xmlDocPtr)cur,(xmlNodePtr)nsMap,curElem->ns,&prevns,
                               (xmlNsMapPtr *)&mi,parnsdone,listRedund._4_4_,
                               (uint)(curElem->type == XML_ATTRIBUTE_NODE));
            if (iVar3 == -1) {
              j = -1;
            }
            curElem->ns = prevns;
          }
          goto LAB_0016b1e8;
        }
        do {
          while( true ) {
            if (curElem == _depth) goto LAB_0016b3a2;
            if (curElem->type == XML_ELEMENT_NODE) {
              if ((mi != (xmlNsMapItemPtr_conflict)0x0) && (mi->next != (xmlNsMapItemPtr)0x0)) {
                while( true ) {
                  bVar2 = false;
                  if (mi->prev != (xmlNsMapItemPtr)0x0) {
                    bVar2 = parnsdone <= mi->prev->depth;
                  }
                  if (!bVar2) break;
                  pxVar1 = (xmlNsPtr)mi->prev;
                  mi->prev = *(xmlNsMapItemPtr *)&pxVar1->type;
                  if (mi->prev == (xmlNsMapItemPtr)0x0) {
                    mi->next = (xmlNsMapItemPtr)0x0;
                  }
                  else {
                    mi->prev->next = (xmlNsMapItemPtr)0x0;
                  }
                  pxVar1->next = mi->oldNs;
                  mi->oldNs = pxVar1;
                }
                for (_optRemoveRedundantNS = mi->next; _optRemoveRedundantNS != (xmlNsMapItemPtr)0x0
                    ; _optRemoveRedundantNS = _optRemoveRedundantNS->next) {
                  if (parnsdone <= _optRemoveRedundantNS->shadowDepth) {
                    _optRemoveRedundantNS->shadowDepth = -1;
                  }
                }
              }
              parnsdone = parnsdone + -1;
            }
            if (curElem->next != (_xmlNode *)0x0) {
              curElem = curElem->next;
              goto LAB_0016b397;
            }
            if (curElem->type == XML_ATTRIBUTE_NODE) break;
            curElem = curElem->parent;
          }
          curElem = curElem->parent;
LAB_0016b214:
        } while ((curElem->type != XML_ELEMENT_NODE) || (curElem->children == (_xmlNode *)0x0));
        curElem = curElem->children;
      }
LAB_0016b397:
    } while (curElem != (xmlNodePtr)0x0);
LAB_0016b3a2:
    if (_nbRedund != (xmlNsPtr *)0x0) {
      local_8c = 0;
      for (local_88 = 0; local_88 < i; local_88 = local_88 + 1) {
        xmlFreeNs(_nbRedund[local_8c]);
        local_8c = local_8c + 2;
      }
      (*xmlFree)(_nbRedund);
    }
    if (mi != (xmlNsMapItemPtr_conflict)0x0) {
      xmlDOMWrapNsMapFree((xmlNsMapPtr)mi);
    }
    ctxt_local._4_4_ = j;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlDOMWrapReconcileNamespaces(xmlDOMWrapCtxtPtr ctxt ATTRIBUTE_UNUSED,
			      xmlNodePtr elem,
			      int options)
{
    int depth = -1, adoptns = 0, parnsdone = 0;
    xmlNsPtr ns, prevns;
    xmlDocPtr doc;
    xmlNodePtr cur, curElem = NULL;
    xmlNsMapPtr nsMap = NULL;
    xmlNsMapItemPtr /* topmi = NULL, */ mi;
    /* @ancestorsOnly should be set by an option flag. */
    int ancestorsOnly = 0;
    int optRemoveRedundantNS =
	((xmlDOMReconcileNSOptions) options & XML_DOM_RECONNS_REMOVEREDUND) ? 1 : 0;
    xmlNsPtr *listRedund = NULL;
    int sizeRedund = 0, nbRedund = 0, ret = 0, i, j;

    if ((elem == NULL) || (elem->doc == NULL) ||
	(elem->type != XML_ELEMENT_NODE))
	return (-1);

    doc = elem->doc;
    cur = elem;
    do {
	switch (cur->type) {
	    case XML_ELEMENT_NODE:
		adoptns = 1;
		curElem = cur;
		depth++;
		/*
		* Namespace declarations.
		*/
		if (cur->nsDef != NULL) {
		    prevns = NULL;
		    ns = cur->nsDef;
		    while (ns != NULL) {
			if (! parnsdone) {
			    if ((elem->parent) &&
				((xmlNodePtr) elem->parent->doc != elem->parent)) {
				/*
				* Gather ancestor in-scope ns-decls.
				*/
				if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				    elem->parent) == -1)
				    ret = -1;
			    }
			    parnsdone = 1;
			}

			/*
			* Lookup the ns ancestor-axis for equal ns-decls in scope.
			*/
			if (optRemoveRedundantNS && XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				      xmlStrEqual(ns->prefix, mi->newNs->prefix)) &&
				    ((ns->href == mi->newNs->href) ||
				      xmlStrEqual(ns->href, mi->newNs->href)))
				{
				    /*
				    * A redundant ns-decl was found.
				    * Add it to the list of redundant ns-decls.
				    */
				    if (xmlDOMWrapNSNormAddNsMapItem2(&listRedund,
					&sizeRedund, &nbRedund, ns, mi->newNs) == -1) {
					ret = -1;
                                    } else {
                                        /*
                                        * Remove the ns-decl from the element-node.
                                        */
                                        if (prevns)
                                            prevns->next = ns->next;
                                        else
                                            cur->nsDef = ns->next;
                                        goto next_ns_decl;
                                    }
				}
			    }
			}

			/*
			* Skip ns-references handling if the referenced
			* ns-decl is declared on the same element.
			*/
			if ((cur->ns != NULL) && adoptns && (cur->ns == ns))
			    adoptns = 0;
			/*
			* Does it shadow any ns-decl?
			*/
			if (XML_NSMAP_NOTEMPTY(nsMap)) {
			    XML_NSMAP_FOREACH(nsMap, mi) {
				if ((mi->depth >= XML_TREE_NSMAP_PARENT) &&
				    (mi->shadowDepth == -1) &&
				    ((ns->prefix == mi->newNs->prefix) ||
				    xmlStrEqual(ns->prefix, mi->newNs->prefix))) {

				    mi->shadowDepth = depth;
				}
			    }
			}
			/*
			* Push mapping.
			*/
			if (xmlDOMWrapNsMapAddItem(&nsMap, -1, ns, ns,
			    depth) == NULL)
			    ret = -1;

			prevns = ns;
next_ns_decl:
			ns = ns->next;
		    }
		}
		if (! adoptns)
		    goto ns_end;
                /* Falls through. */
	    case XML_ATTRIBUTE_NODE:
		/* No ns, no fun. */
		if (cur->ns == NULL)
		    goto ns_end;

		if (! parnsdone) {
		    if ((elem->parent) &&
			((xmlNodePtr) elem->parent->doc != elem->parent)) {
			if (xmlDOMWrapNSNormGatherInScopeNs(&nsMap,
				elem->parent) == -1)
			    ret = -1;
		    }
		    parnsdone = 1;
		}
		/*
		* Adjust the reference if this was a redundant ns-decl.
		*/
		if (listRedund) {
		   for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
		       if (cur->ns == listRedund[j]) {
			   cur->ns = listRedund[++j];
			   break;
		       }
		   }
		}
		/*
		* Adopt ns-references.
		*/
		if (XML_NSMAP_NOTEMPTY(nsMap)) {
		    /*
		    * Search for a mapping.
		    */
		    XML_NSMAP_FOREACH(nsMap, mi) {
			if ((mi->shadowDepth == -1) &&
			    (cur->ns == mi->oldNs)) {

			    cur->ns = mi->newNs;
			    goto ns_end;
			}
		    }
		}
		/*
		* Acquire a normalized ns-decl and add it to the map.
		*/
		if (xmlDOMWrapNSNormAcquireNormalizedNs(doc, curElem,
			cur->ns, &ns,
			&nsMap, depth,
			ancestorsOnly,
			(cur->type == XML_ATTRIBUTE_NODE) ? 1 : 0) == -1)
		    ret = -1;
		cur->ns = ns;

ns_end:
		if ((cur->type == XML_ELEMENT_NODE) &&
		    (cur->properties != NULL)) {
		    /*
		    * Process attributes.
		    */
		    cur = (xmlNodePtr) cur->properties;
		    continue;
		}
		break;
	    default:
		goto next_sibling;
	}
into_content:
	if ((cur->type == XML_ELEMENT_NODE) &&
	    (cur->children != NULL)) {
	    /*
	    * Process content of element-nodes only.
	    */
	    cur = cur->children;
	    continue;
	}
next_sibling:
	if (cur == elem)
	    break;
	if (cur->type == XML_ELEMENT_NODE) {
	    if (XML_NSMAP_NOTEMPTY(nsMap)) {
		/*
		* Pop mappings.
		*/
		while ((nsMap->last != NULL) &&
		    (nsMap->last->depth >= depth))
		{
		    XML_NSMAP_POP(nsMap, mi)
		}
		/*
		* Unshadow.
		*/
		XML_NSMAP_FOREACH(nsMap, mi) {
		    if (mi->shadowDepth >= depth)
			mi->shadowDepth = -1;
		}
	    }
	    depth--;
	}
	if (cur->next != NULL)
	    cur = cur->next;
	else {
	    if (cur->type == XML_ATTRIBUTE_NODE) {
		cur = cur->parent;
		goto into_content;
	    }
	    cur = cur->parent;
	    goto next_sibling;
	}
    } while (cur != NULL);

    if (listRedund) {
	for (i = 0, j = 0; i < nbRedund; i++, j += 2) {
	    xmlFreeNs(listRedund[j]);
	}
	xmlFree(listRedund);
    }
    if (nsMap != NULL)
	xmlDOMWrapNsMapFree(nsMap);
    return (ret);
}